

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int arkStep_NlsConvTest(SUNNonlinearSolver NLS,N_Vector y,N_Vector del,realtype tol,N_Vector ewt,
                       void *arkode_mem)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int m;
  realtype local_40;
  ARKodeARKStepMem step_mem;
  double local_30;
  ARKodeMem ark_mem;
  
  local_40 = tol;
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_NlsConvTest",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (step_mem->linear == 0) {
      local_30 = N_VWrmsNorm(del,ewt);
      iVar1 = SUNNonlinSolGetCurIter(NLS,&m);
      if (iVar1 == 0) {
        if (m < 1) {
          dVar2 = step_mem->crate;
        }
        else {
          dVar2 = step_mem->crdown * step_mem->crate;
          dVar3 = local_30 / step_mem->delp;
          if (dVar2 <= dVar3) {
            dVar2 = dVar3;
          }
          step_mem->crate = dVar2;
        }
        if (1.0 <= dVar2) {
          dVar2 = 1.0;
        }
        iVar1 = 0;
        if ((1.0 < (dVar2 * local_30) / local_40) &&
           ((m < 1 || (iVar1 = 0x386, local_30 <= step_mem->rdiv * step_mem->delp)))) {
          step_mem->delp = local_30;
          iVar1 = 0x385;
        }
      }
      else {
        iVar1 = -0x15;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsConvTest(SUNNonlinearSolver NLS, N_Vector y, N_Vector del,
                        realtype tol, N_Vector ewt, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  realtype delnrm, dcon;
  int m, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsConvTest",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if the problem is linearly implicit, just return success */
  if (step_mem->linear)
    return(SUN_NLS_SUCCESS);

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != ARK_SUCCESS)  return(ARK_MEM_NULL);

  /* update the stored estimate of the convergence rate (assumes linear convergence) */
  if (m > 0)
    step_mem->crate = SUNMAX(step_mem->crdown*step_mem->crate, delnrm/step_mem->delp);

  /* compute our scaled error norm for testing convergence */
  dcon = SUNMIN(step_mem->crate, ONE) * delnrm / tol;

  /* check for convergence; if so return with success */
  if (dcon <= ONE)  return(SUN_NLS_SUCCESS);

  /* check for divergence */
  if ((m >= 1) && (delnrm > step_mem->rdiv*step_mem->delp))
    return(SUN_NLS_CONV_RECVR);

  /* save norm of correction for next iteration */
  step_mem->delp = delnrm;

  /* return with flag that there is more work to do */
  return(SUN_NLS_CONTINUE);
}